

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_unknown_wid(ngram_model_t *model)

{
  int32 iVar1;
  undefined8 in_RAX;
  int32 val;
  int32 local_4;
  
  local_4 = (int32)((ulong)in_RAX >> 0x20);
  iVar1 = hash_table_lookup_int32(model->wid,"<UNK>",&local_4);
  if (iVar1 != -1) {
    iVar1 = local_4;
  }
  return iVar1;
}

Assistant:

int32
ngram_unknown_wid(ngram_model_t * model)
{
    int32 val;

    /* FIXME: This could be memoized for speed if necessary. */
    /* Look up <UNK>, if not found return NGRAM_INVALID_WID. */
    if (hash_table_lookup_int32(model->wid, "<UNK>", &val) == -1)
        return NGRAM_INVALID_WID;
    else
        return val;
}